

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_sse2.c
# Opt level: O1

void SharpYUVUpdateRGB_SSE2(int16_t *ref,int16_t *src,int16_t *dst,int len)

{
  short *psVar1;
  short *psVar2;
  short *psVar3;
  int16_t *piVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  
  uVar27 = 0;
  if (7 < len) {
    uVar26 = 0;
    do {
      psVar1 = ref + uVar26;
      sVar5 = psVar1[1];
      sVar6 = psVar1[2];
      sVar7 = psVar1[3];
      sVar8 = psVar1[4];
      sVar9 = psVar1[5];
      sVar10 = psVar1[6];
      sVar11 = psVar1[7];
      psVar2 = src + uVar26;
      sVar12 = psVar2[1];
      sVar13 = psVar2[2];
      sVar14 = psVar2[3];
      sVar15 = psVar2[4];
      sVar16 = psVar2[5];
      sVar17 = psVar2[6];
      sVar18 = psVar2[7];
      psVar3 = dst + uVar26;
      sVar19 = psVar3[1];
      sVar20 = psVar3[2];
      sVar21 = psVar3[3];
      sVar22 = psVar3[4];
      sVar23 = psVar3[5];
      sVar24 = psVar3[6];
      sVar25 = psVar3[7];
      piVar4 = dst + uVar26;
      *piVar4 = *psVar3 + (*psVar1 - *psVar2);
      piVar4[1] = sVar19 + (sVar5 - sVar12);
      piVar4[2] = sVar20 + (sVar6 - sVar13);
      piVar4[3] = sVar21 + (sVar7 - sVar14);
      piVar4[4] = sVar22 + (sVar8 - sVar15);
      piVar4[5] = sVar23 + (sVar9 - sVar16);
      piVar4[6] = sVar24 + (sVar10 - sVar17);
      piVar4[7] = sVar25 + (sVar11 - sVar18);
      uVar27 = uVar26 + 8;
      uVar28 = uVar26 + 0x10;
      uVar26 = uVar27;
    } while (uVar28 <= (uint)len);
  }
  if ((int)uVar27 < len) {
    uVar27 = uVar27 & 0xffffffff;
    do {
      dst[uVar27] = dst[uVar27] + (ref[uVar27] - src[uVar27]);
      uVar27 = uVar27 + 1;
    } while ((uint)len != uVar27);
  }
  return;
}

Assistant:

static void SharpYUVUpdateRGB_SSE2(const int16_t* ref, const int16_t* src,
                                   int16_t* dst, int len) {
  int i = 0;
  for (i = 0; i + 8 <= len; i += 8) {
    const __m128i A = _mm_loadu_si128((const __m128i*)(ref + i));
    const __m128i B = _mm_loadu_si128((const __m128i*)(src + i));
    const __m128i C = _mm_loadu_si128((const __m128i*)(dst + i));
    const __m128i D = _mm_sub_epi16(A, B);   // diff_uv
    const __m128i E = _mm_add_epi16(C, D);   // new_uv
    _mm_storeu_si128((__m128i*)(dst + i), E);
  }
  for (; i < len; ++i) {
    const int diff_uv = ref[i] - src[i];
    dst[i] += diff_uv;
  }
}